

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::avx::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::avx::CreateLeafSpatial<4,_embree::QuadMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafSpatial<4,_embree::QuadMv<4>_>_> *this,PrimRef *prims
          ,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  FastAllocator *this_00;
  ThreadLocal *pTVar8;
  ThreadLocal2 *this_01;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  value_type pTVar13;
  anon_union_16_2_9473010e_for_vuint_impl<4>_1 aVar14;
  MutexSys *pMVar15;
  value_type pTVar16;
  ulong uVar17;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  long lVar23;
  float *pfVar24;
  ulong uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 in_ZMM0 [64];
  Lock<embree::MutexSys> local_128;
  undefined1 auStack_118 [16];
  undefined1 auStack_108 [16];
  Lock<embree::MutexSys> local_f8;
  undefined1 auStack_e8 [16];
  undefined1 auStack_d8 [16];
  BVHNBuilderT<embree::avx::CreateLeafSpatial<4,_embree::QuadMv<4>_>_> *local_c8;
  range<unsigned_long> *local_c0;
  value_type local_b8;
  undefined8 uStack_b0;
  undefined1 auStack_a8 [16];
  undefined1 auStack_98 [16];
  ThreadLocal2 *local_88;
  undefined8 uStack_80;
  undefined1 auStack_78 [16];
  undefined1 auStack_68 [16];
  vuint<4> vprimID;
  vuint<4> vgeomID;
  
  auVar27 = in_ZMM0._0_16_;
  uVar20 = set->_begin;
  uVar17 = (set->_end - uVar20) + 3 >> 2;
  local_b8 = (value_type)(uVar17 * 0xe0);
  this_00 = alloc->alloc;
  pTVar8 = alloc->talloc1;
  this_01 = pTVar8->parent;
  local_c8 = this;
  local_c0 = set;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_f8.locked = true;
    local_f8.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_128.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_128.locked = true;
    auVar27 = (undefined1  [16])0x0;
    local_88 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_88);
    Lock<embree::MutexSys>::~Lock(&local_128);
    Lock<embree::MutexSys>::~Lock(&local_f8);
  }
  pTVar16 = local_b8;
  pTVar8->bytesUsed = (long)&(local_b8->mutex).mutex + pTVar8->bytesUsed;
  sVar21 = pTVar8->cur;
  uVar22 = (ulong)(-(int)sVar21 & 0xf);
  uVar19 = (long)&(local_b8->mutex).mutex + uVar22 + sVar21;
  pTVar8->cur = uVar19;
  if (pTVar8->end < uVar19) {
    pTVar8->cur = sVar21;
    pTVar13 = (value_type)pTVar8->allocBlockSize;
    if ((value_type)((long)local_b8 * 4) < pTVar13 || (long)local_b8 * 4 - (long)pTVar13 == 0) {
      local_128.mutex = (MutexSys *)pTVar13;
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
      pTVar8->ptr = pcVar18;
      sVar21 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
      pTVar8->bytesWasted = sVar21;
      pTVar8->end = (size_t)local_128.mutex;
      pTVar8->cur = (size_t)pTVar16;
      if (local_128.mutex < pTVar16) {
        pTVar8->cur = 0;
        local_128.mutex = (MutexSys *)pTVar8->allocBlockSize;
        pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
        pTVar8->ptr = pcVar18;
        sVar21 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
        pTVar8->bytesWasted = sVar21;
        pTVar8->end = (size_t)local_128.mutex;
        pTVar8->cur = (size_t)pTVar16;
        if (local_128.mutex < pTVar16) {
          pTVar8->cur = 0;
          pcVar18 = (char *)0x0;
          goto LAB_00c8918f;
        }
      }
      pTVar8->bytesWasted = sVar21;
    }
    else {
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_b8);
    }
  }
  else {
    pTVar8->bytesWasted = pTVar8->bytesWasted + uVar22;
    pcVar18 = pTVar8->ptr + (uVar19 - (long)local_b8);
  }
LAB_00c8918f:
  uVar19 = 0;
  aVar14 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpcmpeqd_avx(auVar27,auVar27);
  local_128.mutex = (MutexSys *)0x0;
  pMVar15 = local_128.mutex;
  for (; uVar19 != uVar17; uVar19 = uVar19 + 1) {
    uVar22 = local_c0->_end;
    pSVar9 = ((local_c8->createLeafFunc).bvh)->scene;
    auStack_108 = (undefined1  [16])0x0;
    local_128.locked = false;
    local_128._9_7_ = 0;
    auStack_118 = (undefined1  [16])0x0;
    auStack_d8 = (undefined1  [16])0x0;
    auStack_e8 = (undefined1  [16])0x0;
    auStack_68 = (undefined1  [16])0x0;
    uStack_80 = 0;
    auStack_78 = (undefined1  [16])0x0;
    auStack_98 = (undefined1  [16])0x0;
    auStack_a8 = (undefined1  [16])0x0;
    pfVar24 = prims[uVar20].upper.field_0.m128 + 3;
    local_128.mutex = pMVar15;
    local_f8.mutex = pMVar15;
    local_f8.locked = local_128.locked;
    local_f8._9_7_ = local_128._9_7_;
    local_b8 = (value_type)pMVar15;
    uStack_b0 = uStack_80;
    local_88 = (ThreadLocal2 *)pMVar15;
    vprimID.field_0 = aVar14;
    vgeomID.field_0 = aVar14;
    for (uVar25 = 0; (uVar25 < 4 && (uVar20 + uVar25 < uVar22)); uVar25 = uVar25 + 1) {
      fVar5 = pfVar24[-4];
      fVar6 = *pfVar24;
      pGVar10 = (pSVar9->geometries).items[(uint)fVar5].ptr;
      lVar26 = (ulong)(uint)fVar6 *
               pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar23 = *(long *)&pGVar10->field_0x58;
      lVar11 = *(long *)&pGVar10[1].time_range.upper;
      p_Var12 = pGVar10[1].intersectionFilterN;
      auVar27 = *(undefined1 (*) [16])(lVar11 + (ulong)*(uint *)(lVar23 + lVar26) * (long)p_Var12);
      auVar2 = *(undefined1 (*) [16])
                (lVar11 + (ulong)*(uint *)(lVar23 + 4 + lVar26) * (long)p_Var12);
      auVar3 = *(undefined1 (*) [16])
                (lVar11 + (ulong)*(uint *)(lVar23 + 8 + lVar26) * (long)p_Var12);
      auVar4 = *(undefined1 (*) [16])
                (lVar11 + (ulong)*(uint *)(lVar23 + 0xc + lVar26) * (long)p_Var12);
      *(int *)((long)&local_128.mutex + uVar25 * 4) = auVar27._0_4_;
      uVar7 = vextractps_avx(auVar27,1);
      *(undefined4 *)(auStack_118 + uVar25 * 4) = uVar7;
      uVar7 = vextractps_avx(auVar27,2);
      *(undefined4 *)(auStack_108 + uVar25 * 4) = uVar7;
      *(int *)((long)&local_f8.mutex + uVar25 * 4) = auVar2._0_4_;
      uVar7 = vextractps_avx(auVar2,1);
      *(undefined4 *)(auStack_e8 + uVar25 * 4) = uVar7;
      uVar7 = vextractps_avx(auVar2,2);
      *(undefined4 *)(auStack_d8 + uVar25 * 4) = uVar7;
      *(int *)((long)&local_88 + uVar25 * 4) = auVar3._0_4_;
      uVar7 = vextractps_avx(auVar3,1);
      *(undefined4 *)(auStack_78 + uVar25 * 4) = uVar7;
      uVar7 = vextractps_avx(auVar3,2);
      *(undefined4 *)(auStack_68 + uVar25 * 4) = uVar7;
      *(int *)((long)&local_b8 + uVar25 * 4) = auVar4._0_4_;
      uVar7 = vextractps_avx(auVar4,1);
      *(undefined4 *)(auStack_a8 + uVar25 * 4) = uVar7;
      uVar7 = vextractps_avx(auVar4,2);
      *(undefined4 *)(auStack_98 + uVar25 * 4) = uVar7;
      vgeomID.field_0.i[uVar25] = (uint)fVar5;
      vprimID.field_0.i[uVar25] = (uint)fVar6;
      pfVar24 = pfVar24 + 8;
    }
    lVar23 = uVar19 * 0xe0;
    auVar27[8] = local_128.locked;
    auVar27._0_8_ = local_128.mutex;
    auVar27._9_7_ = local_128._9_7_;
    auVar2[8] = local_f8.locked;
    auVar2._0_8_ = local_f8.mutex;
    auVar2._9_7_ = local_f8._9_7_;
    auVar4._8_8_ = uStack_80;
    auVar4._0_8_ = local_88;
    auVar3._8_8_ = uStack_b0;
    auVar3._0_8_ = local_b8;
    auVar27 = vmovntps_avx(auVar27);
    *(undefined1 (*) [16])(pcVar18 + lVar23) = auVar27;
    auVar27 = vmovntps_avx(auStack_118);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0x10) = auVar27;
    auVar27 = vmovntps_avx(auStack_108);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0x20) = auVar27;
    auVar27 = vmovntps_avx(auVar2);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0x30) = auVar27;
    auVar27 = vmovntps_avx(auStack_e8);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0x40) = auVar27;
    auVar27 = vmovntps_avx(auStack_d8);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0x50) = auVar27;
    auVar27 = vmovntps_avx(auVar4);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0x60) = auVar27;
    auVar27 = vmovntps_avx(auStack_78);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0x70) = auVar27;
    auVar27 = vmovntps_avx(auStack_68);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0x80) = auVar27;
    auVar27 = vmovntps_avx(auVar3);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0x90) = auVar27;
    auVar27 = vmovntps_avx(auStack_a8);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0xa0) = auVar27;
    auVar27 = vmovntps_avx(auStack_98);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0xb0) = auVar27;
    auVar27 = vmovntps_avx((undefined1  [16])vgeomID.field_0);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0xc0) = auVar27;
    auVar27 = vmovntps_avx((undefined1  [16])vprimID.field_0);
    *(undefined1 (*) [16])(pcVar18 + lVar23 + 0xd0) = auVar27;
    uVar20 = uVar20 + uVar25;
  }
  uVar20 = 7;
  if (uVar17 < 7) {
    uVar20 = uVar17;
  }
  return (NodeRef)(uVar20 | (ulong)pcVar18 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }